

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int sipesh(void *out,size_t outlen,void *in,size_t inlen,void *salt,size_t saltlen,uint t_cost,
          uint m_cost)

{
  int iVar1;
  int iVar2;
  size_t in_RDX;
  yescrypt_local_t *unaff_RBX;
  yescrypt_shared_t *unaff_RBP;
  uint8_t *in_RSI;
  size_t in_RDI;
  uint64_t in_stack_00000030;
  uint32_t in_stack_00000038;
  uint32_t in_stack_00000040;
  uint32_t in_stack_00000048;
  int retval;
  yescrypt_local_t local;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = yescrypt_init_local((yescrypt_local_t *)0x127b2b);
  if (iVar1 == 0) {
    iVar1 = yescrypt_kdf(unaff_RBP,unaff_RBX,
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                         in_RDI,in_RSI,in_RDX,in_stack_00000030,in_stack_00000038,in_stack_00000040,
                         in_stack_00000048,(uint32_t)local.base,(yescrypt_flags_t)local.aligned,
                         (uint8_t *)local.base_size,local.aligned_size);
    iVar2 = yescrypt_free_local((yescrypt_local_t *)0x127bde);
    if (iVar2 != 0) {
      iVar1 = -1;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int sipesh(void *out, size_t outlen, const void *in, size_t inlen, const void *salt, size_t saltlen, unsigned int t_cost, unsigned int m_cost)
{
	yescrypt_local_t local;
	int retval;

	if (yescrypt_init_local(&local))
		return -1;
	retval = yescrypt_kdf(NULL, &local, in, inlen, salt, saltlen,
	    (uint64_t)YESCRYPT_BASE_N << m_cost, YESCRYPT_R, YESCRYPT_P,
	    t_cost, 0, YESCRYPT_FLAGS, out, outlen);
	if (yescrypt_free_local(&local))
		return -1;
	return retval;
}